

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_run.cpp
# Opt level: O3

void __thiscall
just_test_test_case_test_setting_cwd::just_test_test_case_test_setting_cwd
          (just_test_test_case_test_setting_cwd *this)

{
  test_manager *this_00;
  string local_38;
  
  if (just::test::singleton<just::test::test_manager>::_t == (test_manager *)0x0) {
    just::test::singleton<just::test::test_manager>::_t = (test_manager *)operator_new(0x18);
    (just::test::singleton<just::test::test_manager>::_t->_cases).
    super__Vector_base<just::test::test_case,_std::allocator<just::test::test_case>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (just::test::singleton<just::test::test_manager>::_t->_cases).
    super__Vector_base<just::test::test_case,_std::allocator<just::test::test_case>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (just::test::singleton<just::test::test_manager>::_t->_cases).
    super__Vector_base<just::test::test_case,_std::allocator<just::test::test_case>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  this_00 = just::test::singleton<just::test::test_manager>::_t;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"test_setting_cwd","");
  just::test::test_manager::add(this_00,&local_38,just_test_test_case_f_test_setting_cwd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

JUST_TEST_CASE(test_error_of_command)
{
  using std::vector;
  using std::string;

  const vector<string> cmd = run_in_shell("echo hello 1>&2");

  const output o = run(cmd, "");

#ifdef _WIN32
  JUST_ASSERT_EQUAL("hello \r\n", o.standard_error());
#else
  JUST_ASSERT_EQUAL("hello\n", o.standard_error());
#endif
}